

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void btv(void)

{
  DLword DVar1;
  DLword *pDVar2;
  frameex1 *fx_addr68k;
  
  pDVar2 = MachineState.pvar;
  fx_addr68k = (frameex1 *)(MachineState.pvar + -10);
  dump_stackframe(fx_addr68k);
  DVar1 = pDVar2[-10];
  while (DVar1 != 0) {
    fx_addr68k = get_nextFX(fx_addr68k);
    dump_stackframe(fx_addr68k);
    DVar1 = fx_addr68k->alink;
  }
  printf("\n BTV end");
  return;
}

Assistant:

void btv(void) {
  struct frameex1 *fx_addr68k;
  struct frameex1 *get_nextFX(FX * fx);

  fx_addr68k = CURRENTFX;

loop:
  dump_stackframe(fx_addr68k);
  if (fx_addr68k->alink == 0) {
    printf("\n BTV end");
    return;
  }

  fx_addr68k = get_nextFX(fx_addr68k);
  goto loop;
}